

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-writable-after-shutdown.c
# Opt level: O2

int run_test_not_writable_after_shutdown(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_tcp_t socket;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_b_1 = (int64_t)iVar1;
  connect_req.data = (void *)0x0;
  socket.data = (void *)eval_b_1;
  if ((void *)eval_b_1 == (void *)0x0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&socket);
    eval_b_1 = (int64_t)iVar1;
    connect_req.data = (void *)eval_b_1;
    if ((void *)eval_b_1 == (void *)0x0) {
      iVar1 = uv_tcp_connect(&connect_req,&socket,&addr,connect_cb);
      eval_b_1 = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b_1 == (void *)0x0) {
        iVar1 = uv_run(uVar2,0);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b_1 == (void *)0x0) {
          uv_walk(uVar2,close_walk_cb,0);
          uv_run(uVar2,0);
          eval_b_1 = 0;
          iVar1 = uv_loop_close(uVar2);
          eval_b_2 = (int64_t)iVar1;
          if (eval_b_2 == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar4 = "uv_loop_close(loop)";
          pcVar3 = "0";
          uVar2 = 0x43;
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x41;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x3e;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x38;
      eval_b_2 = 0;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0x34;
    eval_b_2 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-writable-after-shutdown.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b_1,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(not_writable_after_shutdown) {
  int r;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_tcp_t socket;
  uv_connect_t connect_req;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_tcp_init(loop, &socket);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &socket,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}